

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O1

void Abc_SclUpsizePerformInt(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  int iVar1;
  Vec_Que_t *pVVar2;
  float *pfVar3;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  bool bVar4;
  SC_Lib *pLib_00;
  int iVar5;
  int iVar6;
  SC_Man *p;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *vCone;
  FILE *__stream;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  Vec_Ptr_t *pVVar13;
  abctime aVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  SC_SizePars *pSVar20;
  Abc_Ntk_t *pAVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  timespec ts;
  int in_stack_ffffffffffffff68;
  timespec local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  SC_SizePars *local_50;
  long local_48;
  Abc_Ntk_t *local_40;
  SC_Lib *local_38;
  
  iVar6 = pPars->TimeOut;
  local_50 = pPars;
  if ((long)iVar6 == 0) {
    lVar17 = 0;
  }
  else {
    iVar5 = clock_gettime(3,&local_80);
    if (iVar5 < 0) {
      lVar17 = -1;
    }
    else {
      lVar17 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    lVar17 = lVar17 + (long)iVar6 * 1000000;
  }
  pSVar20 = local_50;
  if (local_50->fVerbose != 0) {
    printf("Parameters: ");
    printf("Iters =%5d.  ",(ulong)(uint)pSVar20->nIters);
    printf("Time win =%3d %%. ",(ulong)(uint)pSVar20->Window);
    printf("Update ratio =%3d %%. ",(ulong)(uint)pSVar20->Ratio);
    printf("UseDept =%2d. ",(ulong)(uint)pSVar20->fUseDept);
    printf("UseWL =%2d. ",(ulong)(uint)pSVar20->fUseWireLoads);
    printf("Target =%5d ps. ",(ulong)(uint)pSVar20->DelayUser);
    printf("DelayGap =%3d ps. ",(ulong)(uint)pSVar20->DelayGap);
    printf("Timeout =%4d sec",(ulong)(uint)pSVar20->TimeOut);
    putchar(10);
  }
  if (pSVar20->Window == 1) {
    pSVar20->Window = (40000 < pNtk->nObjCounts[7]) + 1;
  }
  p = Abc_SclManStart(pLib,pNtk,pSVar20->fUseWireLoads,pSVar20->fUseDept,0.0,pSVar20->BuffTreeEst);
  iVar6 = clock_gettime(3,&local_80);
  if (iVar6 < 0) {
    aVar14 = -1;
  }
  else {
    aVar14 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  p->timeTotal = aVar14;
  local_38 = pLib;
  if (p->vGatesBest != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGatesBest == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclUpsize.c"
                  ,0x37f,"void Abc_SclUpsizePerformInt(SC_Lib *, Abc_Ntk_t *, SC_SizePars *)");
  }
  pVVar9 = p->pNtk->vGates;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar6 = pVVar9->nSize;
  lVar22 = (long)iVar6;
  pVVar7->nSize = iVar6;
  pVVar7->nCap = iVar6;
  local_40 = pNtk;
  if (lVar22 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc(lVar22 * 4);
  }
  pVVar7->pArray = piVar8;
  memcpy(piVar8,pVVar9->pArray,lVar22 << 2);
  pSVar20 = local_50;
  p->vGatesBest = pVVar7;
  fVar23 = p->MaxDelay0;
  p->BestDelay = fVar23;
  if (fVar23 <= (float)local_50->DelayUser) {
    printf("Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n"
           ,(double)fVar23,(double)local_50->DelayUser);
  }
  else if (0 < local_50->nIters) {
    local_6c = -1;
    pVVar9 = (Vec_Int_t *)0x0;
    pVVar7 = (Vec_Int_t *)0x0;
    local_60 = 0;
    local_5c = 0;
    local_64 = 0;
    local_68 = 0;
    local_54 = 0;
    local_58 = 0;
    iVar6 = 0;
    local_48 = lVar17;
    do {
      iVar16 = pSVar20->Window + (uint)(iVar6 * -0x49249249 + 0xb6db6db6U < 0x24924924);
      iVar5 = iVar16;
      local_70 = iVar6;
      if (iVar16 < 0x65) {
        do {
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar17 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
            lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
          }
          pVVar9 = Abc_SclFindCriticalCoWindow(p,iVar16);
          pVVar7 = Abc_SclFindCriticalNodeWindow(p,pVVar9,iVar16,pSVar20->fUseDept);
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeCone = p->timeCone + lVar22 + lVar17;
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar17 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
            lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
          }
          if ((pSVar20->BypassFreq == 0 || local_70 == 0) || (local_70 % pSVar20->BypassFreq != 0))
          {
            local_6c = Abc_SclFindUpsizes(p,pVVar7,pSVar20->Ratio,pSVar20->Notches,local_70,
                                          pSVar20->DelayGap,in_stack_ffffffffffffff68);
          }
          else {
            in_stack_ffffffffffffff68 = pSVar20->fVeryVerbose;
            local_6c = Abc_SclFindBypasses(p,pVVar7,0,pSVar20->Notches,local_70,pSVar20->DelayGap,
                                           in_stack_ffffffffffffff68);
          }
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeSize = p->timeSize + lVar22 + lVar17;
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar17 = 1;
          }
          else {
            lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
            lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
          }
          Abc_SclUnmarkCriticalNodeWindow(p,pVVar7);
          Abc_SclUnmarkCriticalNodeWindow(p,pVVar9);
          iVar6 = clock_gettime(3,&local_80);
          if (iVar6 < 0) {
            lVar22 = -1;
          }
          else {
            lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
          }
          p->timeCone = p->timeCone + lVar22 + lVar17;
          iVar5 = iVar16;
          if (0 < local_6c) break;
          if (pVVar9->pArray != (int *)0x0) {
            free(pVVar9->pArray);
            pVVar9->pArray = (int *)0x0;
          }
          if (pVVar9 != (Vec_Int_t *)0x0) {
            free(pVVar9);
          }
          if (pVVar7->pArray != (int *)0x0) {
            free(pVVar7->pArray);
            pVVar7->pArray = (int *)0x0;
          }
          if (pVVar7 != (Vec_Int_t *)0x0) {
            free(pVVar7);
          }
          iVar5 = iVar16 * 2;
          bVar4 = iVar16 < 0x33;
          iVar16 = iVar5;
        } while (bVar4);
      }
      lVar17 = local_48;
      iVar6 = local_70;
      if (local_6c == 0) goto LAB_0047cb9d;
      iVar6 = clock_gettime(3,&local_80);
      if (iVar6 < 0) {
        lVar22 = 1;
      }
      else {
        lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
        lVar22 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_80.tv_sec * -1000000;
      }
      if (pSVar20->fUseDept == 0) {
        vCone = Abc_SclFindTFO(p->pNtk,pVVar7);
        Abc_SclTimeCone(p,vCone);
        local_54 = vCone->nSize;
        if (vCone->pArray != (int *)0x0) {
          free(vCone->pArray);
          vCone->pArray = (int *)0x0;
        }
        pSVar20 = local_50;
        if (vCone != (Vec_Int_t *)0x0) {
          free(vCone);
          pSVar20 = local_50;
        }
      }
      else if ((p->vChanged->nSize == 0) ||
              ((local_70 != 0 && pSVar20->BypassFreq != 0 && (local_70 % pSVar20->BypassFreq == 0)))
              ) {
        Abc_SclTimeNtkRecompute(p,(float *)0x0,(float *)0x0,pSVar20->fUseDept,0.0);
      }
      else {
        local_54 = Abc_SclTimeIncUpdate(p);
      }
      iVar6 = clock_gettime(3,&local_80);
      lVar17 = local_48;
      if (iVar6 < 0) {
        lVar15 = -1;
      }
      else {
        lVar15 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      p->timeTime = p->timeTime + lVar15 + lVar22;
      iVar6 = p->vQue->nSize;
      if (iVar6 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      uVar11 = 0xffffffff;
      if (iVar6 != 1) {
        uVar11 = p->vQue->pHeap[1];
      }
      if ((int)uVar11 < 0) {
LAB_0047d9df:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pVVar13 = p->pNtk->vCos;
      if (pVVar13->nSize <= (int)uVar11) goto LAB_0047d9df;
      uVar11 = *(uint *)((long)pVVar13->pArray[uVar11] + 0x10);
      fVar23 = p->pTimes[uVar11].rise;
      fVar24 = p->pTimes[uVar11].fall;
      if (fVar23 <= fVar24) {
        fVar23 = fVar24;
      }
      p->MaxDelay = fVar23;
      if (p->BestDelay <= fVar23) {
        local_58 = local_58 + 1;
      }
      else {
        p->BestDelay = fVar23;
        Abc_SclApplyUpdateToBest(p->vGatesBest,p->pNtk->vGates,p->vUpdates);
        p->vUpdates2->nSize = 0;
        local_58 = 0;
      }
      uVar11 = 1;
      if (pSVar20->fVeryVerbose == 0) {
        uVar11 = (uint)(local_58 == 0 && pSVar20->fVerbose != 0);
      }
      in_stack_ffffffffffffff68 = local_54;
      Abc_SclUpsizePrint(p,local_70,iVar5,pVVar9->nSize,pVVar7->nSize,local_6c,local_54,uVar11);
      local_68 = local_68 + pVVar9->nSize;
      local_64 = local_64 + pVVar7->nSize;
      if (pVVar9->pArray != (int *)0x0) {
        free(pVVar9->pArray);
        pVVar9->pArray = (int *)0x0;
      }
      if (pVVar9 != (Vec_Int_t *)0x0) {
        free(pVVar9);
      }
      if (pVVar7->pArray != (int *)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (int *)0x0;
      }
      if (pVVar7 != (Vec_Int_t *)0x0) {
        free(pVVar7);
      }
      local_5c = local_5c + local_54;
      local_60 = local_60 + local_6c;
      if (lVar17 != 0) {
        iVar6 = clock_gettime(3,&local_80);
        if (iVar6 < 0) {
          lVar22 = -1;
        }
        else {
          lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        iVar6 = local_70;
        if (lVar17 < lVar22) goto LAB_0047cb9d;
      }
      iVar6 = local_70;
      if (((pSVar20->nIterNoChange < local_58) || (p->BestDelay <= (float)pSVar20->DelayUser)) ||
         (iVar6 = local_70 + 1, pSVar20->nIters <= iVar6)) goto LAB_0047cb9d;
    } while( true );
  }
  local_68 = 0;
  local_64 = 0;
  local_5c = 0;
  local_60 = 0;
  iVar6 = 0;
LAB_0047cb9d:
  pAVar21 = p->pNtk;
  pVVar9 = p->vGatesBest;
  p->vGatesBest = pAVar21->vGates;
  pAVar21->vGates = pVVar9;
  if (pSVar20->BypassFreq != 0) {
    Abc_SclUndoRecentChanges(pAVar21,p->vUpdates2);
  }
  pAVar21 = local_40;
  if (pSVar20->BypassFreq != 0) {
    Abc_SclUpsizeRemoveDangling(p,local_40);
  }
  Abc_SclTimeNtkRecompute(p,&p->SumArea,&p->MaxDelay,0,0.0);
  if (pSVar20->fVerbose == 0) {
    printf(
          "                                                                                                                                                  \r"
          );
  }
  else {
    iVar5 = iVar6 + (uint)(iVar6 == 0);
    Abc_SclUpsizePrint(p,iVar6,pSVar20->Window,local_68 / iVar5,local_64 / iVar5,local_60 / iVar5,
                       local_5c / iVar5,1);
  }
  iVar5 = 3;
  iVar6 = clock_gettime(3,&local_80);
  if (iVar6 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  lVar22 = lVar22 - p->timeTotal;
  p->timeTotal = lVar22;
  if (pSVar20->fVerbose != 0) {
    p->timeOther = lVar22 - (p->timeCone + p->timeSize + p->timeTime);
    Abc_Print(iVar5,"%s =","Runtime: Critical path");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeCone * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeCone / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Sizing eval  ");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeSize * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeSize / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Timing update");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: Other        ");
    dVar25 = 0.0;
    if (p->timeTotal != 0) {
      dVar25 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar25);
    Abc_Print(iVar5,"%s =","Runtime: TOTAL        ");
    dVar25 = (double)p->timeTotal;
    dVar26 = 0.0;
    if (p->timeTotal != 0) {
      dVar26 = (dVar25 * 100.0) / dVar25;
    }
    Abc_Print(iVar5,"%9.2f sec (%6.2f %%)\n",dVar25 / 1000000.0,dVar26);
    pSVar20 = local_50;
  }
  if (pSVar20->fDumpStats != 0) {
    __stream = fopen("stats2.txt","a+");
    pcVar10 = p->pNtk->pName;
    iVar6 = strcmp(Abc_SclDumpStats_FileNameOld,pcVar10);
    if (iVar6 == 0) {
      fputc(0x20,__stream);
      fprintf(__stream,"%.1f ",
              ((double)p->pNtk->nObjCounts[7] * 100.0) / (double)Abc_SclDumpStats_nNodesOld);
      fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats_nAreaOld
             );
      fprintf(__stream,"%.1f ",
              ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats_nDelayOld);
      iVar6 = clock_gettime(3,&local_80);
      if (iVar6 < 0) {
        lVar22 = -1;
      }
      else {
        lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      fprintf(__stream,"%.2f",(double)(lVar22 - Abc_SclDumpStats_clk) / 1000000.0);
    }
    else {
      strcpy(Abc_SclDumpStats_FileNameOld,pcVar10);
      fputc(10,__stream);
      pcVar10 = Extra_FileNameWithoutPath(p->pNtk->pName);
      fprintf(__stream,"%s ",pcVar10);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPis->nSize);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPos->nSize);
      Abc_SclDumpStats_nNodesOld = p->pNtk->nObjCounts[7];
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nAreaOld = (int)p->SumArea;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nDelayOld = (int)p->ReportDelay;
      fprintf(__stream,"%d ");
      iVar6 = clock_gettime(3,&local_80);
      if (iVar6 < 0) {
        Abc_SclDumpStats_clk = -1;
      }
      else {
        Abc_SclDumpStats_clk = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
    }
    fclose(__stream);
  }
  pLib_00 = local_38;
  if (lVar17 != 0) {
    iVar6 = clock_gettime(3,&local_80);
    if (iVar6 < 0) {
      lVar22 = -1;
    }
    else {
      lVar22 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    if (lVar17 < lVar22) {
      printf("Gate sizing timed out at %d seconds.\n",(ulong)(uint)local_50->TimeOut);
    }
  }
  Abc_SclSclGates2MioGates(pLib_00,pAVar21);
  pVVar13 = p->pNtk->vCis;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      *(undefined4 *)((long)pVVar13->pArray[lVar17] + 0x38) = 0;
      lVar17 = lVar17 + 1;
      pVVar13 = p->pNtk->vCis;
    } while (lVar17 < pVVar13->nSize);
  }
  pAVar21 = p->pNtk;
  pVVar13 = pAVar21->vCos;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      *(undefined4 *)((long)pVVar13->pArray[lVar17] + 0x38) = 0;
      lVar17 = lVar17 + 1;
      pAVar21 = p->pNtk;
      pVVar13 = pAVar21->vCos;
    } while (lVar17 < pVVar13->nSize);
  }
  pAVar21->pSCLib = (void *)0x0;
  if (pAVar21->vGates != (Vec_Int_t *)0x0) {
    piVar8 = pAVar21->vGates->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      pAVar21->vGates->pArray = (int *)0x0;
    }
    if (pAVar21->vGates != (Vec_Int_t *)0x0) {
      free(pAVar21->vGates);
      pAVar21->vGates = (Vec_Int_t *)0x0;
    }
  }
  if (p->vNodeIter != (Vec_Int_t *)0x0) {
    piVar8 = p->vNodeIter->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vNodeIter->pArray = (int *)0x0;
    }
    if (p->vNodeIter != (Vec_Int_t *)0x0) {
      free(p->vNodeIter);
      p->vNodeIter = (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = p->vNodeByGain;
  if (pVVar2 != (Vec_Que_t *)0x0) {
    if (pVVar2->pOrder != (int *)0x0) {
      free(pVVar2->pOrder);
      pVVar2->pOrder = (int *)0x0;
    }
    if (pVVar2->pHeap != (int *)0x0) {
      free(pVVar2->pHeap);
      pVVar2->pHeap = (int *)0x0;
    }
    free(pVVar2);
  }
  p->vNodeByGain = (Vec_Que_t *)0x0;
  if (p->vNode2Gain != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vNode2Gain->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vNode2Gain->pArray = (float *)0x0;
    }
    if (p->vNode2Gain != (Vec_Flt_t *)0x0) {
      free(p->vNode2Gain);
      p->vNode2Gain = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vNode2Gate != (Vec_Int_t *)0x0) {
    piVar8 = p->vNode2Gate->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vNode2Gate->pArray = (int *)0x0;
    }
    if (p->vNode2Gate != (Vec_Int_t *)0x0) {
      free(p->vNode2Gate);
      p->vNode2Gate = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLoads2 != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vLoads2->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vLoads2->pArray = (float *)0x0;
    }
    if (p->vLoads2 != (Vec_Flt_t *)0x0) {
      free(p->vLoads2);
      p->vLoads2 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vLoads3 != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vLoads3->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vLoads3->pArray = (float *)0x0;
    }
    if (p->vLoads3 != (Vec_Flt_t *)0x0) {
      free(p->vLoads3);
      p->vLoads3 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vTimes2 != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vTimes2->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vTimes2->pArray = (float *)0x0;
    }
    if (p->vTimes2 != (Vec_Flt_t *)0x0) {
      free(p->vTimes2);
      p->vTimes2 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vTimes3 != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vTimes3->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vTimes3->pArray = (float *)0x0;
    }
    if (p->vTimes3 != (Vec_Flt_t *)0x0) {
      free(p->vTimes3);
      p->vTimes3 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vUpdates != (Vec_Int_t *)0x0) {
    piVar8 = p->vUpdates->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vUpdates->pArray = (int *)0x0;
    }
    if (p->vUpdates != (Vec_Int_t *)0x0) {
      free(p->vUpdates);
      p->vUpdates = (Vec_Int_t *)0x0;
    }
  }
  if (p->vUpdates2 != (Vec_Int_t *)0x0) {
    piVar8 = p->vUpdates2->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vUpdates2->pArray = (int *)0x0;
    }
    if (p->vUpdates2 != (Vec_Int_t *)0x0) {
      free(p->vUpdates2);
      p->vUpdates2 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGatesBest != (Vec_Int_t *)0x0) {
    piVar8 = p->vGatesBest->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vGatesBest->pArray = (int *)0x0;
    }
    if (p->vGatesBest != (Vec_Int_t *)0x0) {
      free(p->vGatesBest);
      p->vGatesBest = (Vec_Int_t *)0x0;
    }
  }
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar22 = 8;
      lVar17 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar22);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar22) = 0;
        }
        lVar17 = lVar17 + 1;
        lVar22 = lVar22 + 0x10;
      } while (lVar17 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  if (p->vChanged != (Vec_Int_t *)0x0) {
    piVar8 = p->vChanged->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vChanged->pArray = (int *)0x0;
    }
    if (p->vChanged != (Vec_Int_t *)0x0) {
      free(p->vChanged);
      p->vChanged = (Vec_Int_t *)0x0;
    }
  }
  pVVar2 = p->vQue;
  iVar6 = pVVar2->nSize;
  if (iVar6 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar5 = pVVar2->nCap;
  if (iVar5 < iVar6) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar11 = iVar6 - 1;
  uVar19 = 0;
  if (iVar6 != 1) {
    uVar19 = 0;
    do {
      if (pVVar2->pOrder[uVar19] < 1) {
        __assert_fail("p->pOrder[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar19 = uVar19 + 1;
    } while (uVar11 != uVar19);
    uVar19 = (ulong)uVar11;
  }
  if ((int)uVar19 < iVar5) {
    piVar8 = pVVar2->pOrder + uVar19;
    do {
      if (*piVar8 != -1) {
        __assert_fail("p->pOrder[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar12 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar12;
      piVar8 = piVar8 + 1;
    } while ((int)uVar12 < iVar5);
  }
  piVar8 = pVVar2->pHeap;
  if (*piVar8 != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,300,"void Vec_QueCheck(Vec_Que_t *)");
  }
  if (iVar6 == 1) {
    uVar19 = 0;
  }
  else {
    uVar19 = 1;
    if (1 < (int)uVar11) {
      uVar19 = (ulong)uVar11;
    }
    uVar18 = 0;
    do {
      if (uVar18 != (uint)piVar8[pVVar2->pOrder[uVar18]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  while (uVar19 = uVar19 + 1, (long)uVar19 < (long)iVar5) {
    if (piVar8[uVar19] != -1) {
      __assert_fail("p->pHeap[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                    ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  if (iVar6 != 1) {
    iVar5 = 2;
    if (2 < iVar6) {
      iVar5 = iVar6;
    }
    uVar19 = 2;
    lVar17 = 0x300000000;
    iVar16 = 3;
    lVar22 = 0x200000000;
    do {
      if ((int)uVar19 < iVar6) {
        iVar1 = *(int *)((long)piVar8 + uVar19 * 2);
        pfVar3 = *pVVar2->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar23 = (float)iVar1;
        }
        else {
          fVar23 = pfVar3[iVar1];
        }
        iVar1 = *(int *)((long)piVar8 + (lVar22 >> 0x1e));
        if (pfVar3 == (float *)0x0) {
          fVar24 = (float)iVar1;
        }
        else {
          fVar24 = pfVar3[iVar1];
        }
        if (fVar23 < fVar24) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar16 < iVar6) {
        iVar1 = *(int *)((long)piVar8 + uVar19 * 2);
        pfVar3 = *pVVar2->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar23 = (float)iVar1;
        }
        else {
          fVar23 = pfVar3[iVar1];
        }
        iVar1 = *(int *)((long)piVar8 + (lVar17 >> 0x1e));
        if (pfVar3 == (float *)0x0) {
          fVar24 = (float)iVar1;
        }
        else {
          fVar24 = pfVar3[iVar1];
        }
        if (fVar23 < fVar24) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      lVar22 = lVar22 + 0x200000000;
      uVar19 = uVar19 + 2;
      lVar17 = lVar17 + 0x200000000;
      iVar16 = iVar16 + 2;
    } while ((uint)(iVar5 * 2) != uVar19);
  }
  if (pVVar2->pOrder != (int *)0x0) {
    free(pVVar2->pOrder);
    pVVar2->pOrder = (int *)0x0;
  }
  if (pVVar2->pHeap != (int *)0x0) {
    free(pVVar2->pHeap);
    pVVar2->pHeap = (int *)0x0;
  }
  free(pVVar2);
  p->vQue = (Vec_Que_t *)0x0;
  if (p->vTimesOut != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vTimesOut->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vTimesOut->pArray = (float *)0x0;
    }
    if (p->vTimesOut != (Vec_Flt_t *)0x0) {
      free(p->vTimesOut);
      p->vTimesOut = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vBestFans != (Vec_Int_t *)0x0) {
    piVar8 = p->vBestFans->pArray;
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      p->vBestFans->pArray = (int *)0x0;
    }
    if (p->vBestFans != (Vec_Int_t *)0x0) {
      free(p->vBestFans);
      p->vBestFans = (Vec_Int_t *)0x0;
    }
  }
  if (p->vInDrive != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vInDrive->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vInDrive->pArray = (float *)0x0;
    }
    if (p->vInDrive != (Vec_Flt_t *)0x0) {
      free(p->vInDrive);
      p->vInDrive = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vWireCaps != (Vec_Flt_t *)0x0) {
    pfVar3 = p->vWireCaps->pArray;
    if (pfVar3 != (float *)0x0) {
      free(pfVar3);
      p->vWireCaps->pArray = (float *)0x0;
    }
    if (p->vWireCaps != (Vec_Flt_t *)0x0) {
      free(p->vWireCaps);
      p->vWireCaps = (Vec_Flt_t *)0x0;
    }
  }
  if (p->pLoads != (SC_Pair *)0x0) {
    free(p->pLoads);
    p->pLoads = (SC_Pair *)0x0;
  }
  if (p->pDepts != (SC_Pair *)0x0) {
    free(p->pDepts);
    p->pDepts = (SC_Pair *)0x0;
  }
  if (p->pTimes != (SC_Pair *)0x0) {
    free(p->pTimes);
    p->pTimes = (SC_Pair *)0x0;
  }
  if (p->pSlews != (SC_Pair *)0x0) {
    free(p->pSlews);
    p->pSlews = (SC_Pair *)0x0;
  }
  if (p != (SC_Man *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_SclUpsizePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    SC_Man * p;
    Vec_Int_t * vPathPos = NULL;    // critical POs
    Vec_Int_t * vPathNodes = NULL;  // critical nodes and PIs
    abctime clk, nRuntimeLimit = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    int i = 0, win, nUpsizes = -1, nFramesNoChange = 0, nConeSize = 0;
    int nAllPos, nAllNodes, nAllTfos, nAllUpsizes;
    if ( pPars->fVerbose )
    {
        printf( "Parameters: " );
        printf( "Iters =%5d.  ",          pPars->nIters   );
        printf( "Time win =%3d %%. ",     pPars->Window   );
        printf( "Update ratio =%3d %%. ", pPars->Ratio    );
        printf( "UseDept =%2d. ",         pPars->fUseDept );
        printf( "UseWL =%2d. ",           pPars->fUseWireLoads );
        printf( "Target =%5d ps. ",       pPars->DelayUser );
        printf( "DelayGap =%3d ps. ",     pPars->DelayGap );
        printf( "Timeout =%4d sec",       pPars->TimeOut  );
        printf( "\n" );
    }
    // increase window for larger networks
    if ( pPars->Window == 1 )
        pPars->Window += (Abc_NtkNodeNum(pNtk) > 40000);
    // prepare the manager; collect init stats
    p = Abc_SclManStart( pLib, pNtk, pPars->fUseWireLoads, pPars->fUseDept, 0, pPars->BuffTreeEst );
    p->timeTotal  = Abc_Clock();
    assert( p->vGatesBest == NULL );
    p->vGatesBest = Vec_IntDup( p->pNtk->vGates );
    p->BestDelay  = p->MaxDelay0;
    // perform upsizing
    nAllPos = nAllNodes = nAllTfos = nAllUpsizes = 0;
    if ( p->BestDelay <= pPars->DelayUser )
        printf( "Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n", p->BestDelay, (float)pPars->DelayUser );
    else
    for ( i = 0; i < pPars->nIters; i++ )
    {
        for ( win = pPars->Window + ((i % 7) == 6); win <= 100;  win *= 2 )
        {
            // detect critical path
            clk = Abc_Clock();
            vPathPos   = Abc_SclFindCriticalCoWindow( p, win );
            vPathNodes = Abc_SclFindCriticalNodeWindow( p, vPathPos, win, pPars->fUseDept );
            p->timeCone += Abc_Clock() - clk;

            // selectively upsize the nodes
            clk = Abc_Clock();
            if ( pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0 )
                nUpsizes = Abc_SclFindBypasses( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, pPars->fVeryVerbose );
            else
                nUpsizes = Abc_SclFindUpsizes( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, (pPars->BypassFreq > 0) );
            p->timeSize += Abc_Clock() - clk;

            // unmark critical path
            clk = Abc_Clock();
            Abc_SclUnmarkCriticalNodeWindow( p, vPathNodes );
            Abc_SclUnmarkCriticalNodeWindow( p, vPathPos );
            p->timeCone += Abc_Clock() - clk;
            if ( nUpsizes > 0 )
                break;
            Vec_IntFree( vPathPos );
            Vec_IntFree( vPathNodes );
        }
        if ( nUpsizes == 0 )
            break;

        // update timing information
        clk = Abc_Clock();
        if ( pPars->fUseDept )
        {
            if ( Vec_IntSize(p->vChanged) && !(pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0) )
                nConeSize = Abc_SclTimeIncUpdate( p );
            else
                Abc_SclTimeNtkRecompute( p, NULL, NULL, pPars->fUseDept, 0 );
        }
        else
        {
            Vec_Int_t * vTFO = Abc_SclFindTFO( p->pNtk, vPathNodes );
            Abc_SclTimeCone( p, vTFO );
            nConeSize = Vec_IntSize( vTFO );
            Vec_IntFree( vTFO );
        }
        p->timeTime += Abc_Clock() - clk;
//        Abc_SclUpsizePrintDiffs( p, pLib, pNtk );

        // save the best network
        p->MaxDelay = Abc_SclReadMaxDelay( p );
        if ( p->BestDelay > p->MaxDelay )
        {
            p->BestDelay = p->MaxDelay;
            Abc_SclApplyUpdateToBest( p->vGatesBest, p->pNtk->vGates, p->vUpdates );
            Vec_IntClear( p->vUpdates2 );
            nFramesNoChange = 0;
        }
        else
            nFramesNoChange++;

        // report and cleanup
        Abc_SclUpsizePrint( p, i, win, Vec_IntSize(vPathPos), Vec_IntSize(vPathNodes), nUpsizes, nConeSize, pPars->fVeryVerbose || (pPars->fVerbose && nFramesNoChange == 0) ); //|| (i == nIters-1) );
        nAllPos     += Vec_IntSize(vPathPos);
        nAllNodes   += Vec_IntSize(vPathNodes);
        nAllTfos    += nConeSize;
        nAllUpsizes += nUpsizes;
        Vec_IntFree( vPathPos );
        Vec_IntFree( vPathNodes );
        // check timeout
        if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
            break;
        // check no change
        if ( nFramesNoChange > pPars->nIterNoChange )
            break;
        // check best delay
        if ( p->BestDelay <= pPars->DelayUser )
            break;
    }
    // update for best gates and recompute timing
    ABC_SWAP( Vec_Int_t *, p->vGatesBest, p->pNtk->vGates );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUndoRecentChanges( p->pNtk, p->vUpdates2 );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUpsizeRemoveDangling( p, pNtk );
    Abc_SclTimeNtkRecompute( p, &p->SumArea, &p->MaxDelay, 0, 0 );
    if ( pPars->fVerbose )
        Abc_SclUpsizePrint( p, i, pPars->Window, nAllPos/(i?i:1), nAllNodes/(i?i:1), nAllUpsizes/(i?i:1), nAllTfos/(i?i:1), 1 );
    else
        printf( "                                                                                                                                                  \r" );
    // report runtime
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeCone - p->timeSize - p->timeTime;
        ABC_PRTP( "Runtime: Critical path", p->timeCone,  p->timeTotal );
        ABC_PRTP( "Runtime: Sizing eval  ", p->timeSize,  p->timeTotal );
        ABC_PRTP( "Runtime: Timing update", p->timeTime,  p->timeTotal );
        ABC_PRTP( "Runtime: Other        ", p->timeOther, p->timeTotal );
        ABC_PRTP( "Runtime: TOTAL        ", p->timeTotal, p->timeTotal );
    }
    if ( pPars->fDumpStats )
        Abc_SclDumpStats( p, "stats2.txt", p->timeTotal );
    if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
        printf( "Gate sizing timed out at %d seconds.\n", pPars->TimeOut );

    // save the result and quit
    Abc_SclSclGates2MioGates( pLib, pNtk ); // updates gate pointers
    Abc_SclManFree( p );
//    Abc_NtkCleanMarkAB( pNtk );
}